

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.hpp
# Opt level: O0

typed_address<pstore::trailer>
pstore::database::get_footer_pos<pstore::file::in_memory>(in_memory *file)

{
  bool bVar1;
  reference pvVar2;
  string local_100;
  uint64_t local_e0;
  uint64_t file_size;
  uint64_t footer_offset;
  string local_b0;
  string local_90;
  unique_ptr<pstore::header,_const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_include_pstore_core_database_hpp:574:27)>
  local_60;
  unique_ptr<pstore::header,_const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_include_pstore_core_database_hpp:574:27)>
  deleter;
  anon_class_1_0_00000001 dtor;
  header *h;
  type header_storage;
  in_memory *file_local;
  typed_address<pstore::trailer> result;
  
  header_storage._40_8_ = file;
  bVar1 = pstore::file::in_memory::is_open(file);
  if (!bVar1) {
    assert_failed("file.is_open ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/database.hpp"
                  ,0x237);
  }
  header_storage._24_8_ = 0;
  header_storage._32_8_ = 0;
  header_storage._8_8_ = 0;
  header_storage._16_8_ = 0;
  h = (header *)0x0;
  header_storage.__align = (anon_struct_8_0_00000001_for___align)0x0;
  pstore::file::in_memory::seek((in_memory *)header_storage._40_8_,0);
  pstore::file::file_base::read<pstore::header,void>((file_base *)header_storage._40_8_,(pointer)&h)
  ;
  std::
  unique_ptr<pstore::header,pstore::database::get_footer_pos<pstore::file::in_memory>(pstore::file::in_memory&)::{lambda(pstore::header*)#1}const>
  ::
  unique_ptr<pstore::database::get_footer_pos<pstore::file::in_memory>(pstore::file::in_memory&)::_lambda(pstore::header*)_1_const,void>
            ((unique_ptr<pstore::header,pstore::database::get_footer_pos<pstore::file::in_memory>(pstore::file::in_memory&)::_lambda(pstore::header*)_1_const>
              *)&local_60,(pointer)&h,
             (deleter_type *)
             ((long)&deleter._M_t.
                     super___uniq_ptr_impl<pstore::header,_const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_include_pstore_core_database_hpp:574:27)>
                     ._M_t.
                     super__Tuple_impl<0UL,_pstore::header_*,_const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_include_pstore_core_database_hpp:574:27)>
                     .super__Head_base<0UL,_pstore::header_*,_false>._M_head_impl + 7));
  bVar1 = std::operator!=((array<unsigned_char,_4UL> *)&h,
                          (array<unsigned_char,_4UL> *)&header::file_signature1);
  if ((bVar1) || (h._4_4_ != 0x507ffff)) {
    pstore::file::in_memory::path_abi_cxx11_(&local_90,(in_memory *)header_storage._40_8_);
    raise<pstore::error_code,std::__cxx11::string>(header_corrupt,&local_90);
  }
  if (header_storage._4_4_ == 0x30) {
    pvVar2 = std::array<unsigned_short,_2UL>::operator[]
                       ((array<unsigned_short,_2UL> *)&header_storage.__align,0);
    if (*pvVar2 == 1) {
      pvVar2 = std::array<unsigned_short,_2UL>::operator[]
                         ((array<unsigned_short,_2UL> *)&header_storage.__align,1);
      if (*pvVar2 == 0xd) {
        bVar1 = header::is_valid((pointer)&h);
        if (!bVar1) {
          pstore::file::in_memory::path_abi_cxx11_
                    ((string *)&footer_offset,(in_memory *)header_storage._40_8_);
          raise<pstore::error_code,std::__cxx11::string>
                    (header_corrupt,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &footer_offset);
        }
        file_local = (in_memory *)
                     std::atomic<pstore::typed_address<pstore::trailer>_>::load
                               ((atomic<pstore::typed_address<pstore::trailer>_> *)
                                (header_storage.__data + 0x20),memory_order_seq_cst);
        file_size = typed_address<pstore::trailer>::absolute
                              ((typed_address<pstore::trailer> *)&file_local);
        local_e0 = pstore::file::in_memory::size((in_memory *)header_storage._40_8_);
        if (((0x3f < file_size) && (0xaf < local_e0)) && (file_size <= local_e0 - 0x70)) {
          std::
          unique_ptr<pstore::header,_const_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/database.hpp:574:27)>
          ::~unique_ptr(&local_60);
          return (typed_address<pstore::trailer>)(address)file_local;
        }
        pstore::file::in_memory::path_abi_cxx11_(&local_100,(in_memory *)header_storage._40_8_);
        raise<pstore::error_code,std::__cxx11::string>(header_corrupt,&local_100);
      }
    }
  }
  pstore::file::in_memory::path_abi_cxx11_(&local_b0,(in_memory *)header_storage._40_8_);
  raise<pstore::error_code,std::__cxx11::string>(header_version_mismatch,&local_b0);
}

Assistant:

auto database::get_footer_pos (File & file) -> typed_address<trailer> {
        static_assert (std::is_base_of<file::file_base, File>::value,
                       "File type must be derived from file::file_base");
        PSTORE_ASSERT (file.is_open ());

        std::aligned_storage<sizeof (header), alignof (header)>::type header_storage{};
        auto h = reinterpret_cast<header *> (&header_storage);
        file.seek (0);
        file.read (h);

        auto const dtor = [] (header * const p) { p->~header (); };
        std::unique_ptr<header, decltype (dtor)> deleter (h, dtor);

#if PSTORE_SIGNATURE_CHECKS_ENABLED
        if (h->a.signature1 != header::file_signature1 ||
            h->a.signature2 != header::file_signature2) {
            raise (error_code::header_corrupt, file.path ());
        }
#endif
        if (h->a.header_size != sizeof (class header) || h->a.version[0] != header::major_version ||
            h->a.version[1] != header::minor_version) {
            raise (error_code::header_version_mismatch, file.path ());
        }
        if (!h->is_valid ()) {
            raise (pstore::error_code::header_corrupt, file.path ());
        }

        typed_address<trailer> const result = h->footer_pos.load ();
        std::uint64_t const footer_offset = result.absolute ();
        std::uint64_t const file_size = file.size ();
        if (footer_offset < leader_size || file_size < leader_size + sizeof (trailer) ||
            footer_offset > file_size - sizeof (trailer)) {
            raise (error_code::header_corrupt, file.path ());
        }
        return result;
    }